

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

void Gia_PolyCollectRoots_rec
               (Vec_Int_t *vAdds,Vec_Wec_t *vMap,Vec_Bit_t *vMarks,int iBox,Vec_Int_t *vRoots)

{
  int i_00;
  int iVar1;
  int i_01;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *vLevel;
  int Carry;
  int Sum;
  int Index;
  int i;
  int k;
  Vec_Int_t *vRoots_local;
  int iBox_local;
  Vec_Bit_t *vMarks_local;
  Vec_Wec_t *vMap_local;
  Vec_Int_t *vAdds_local;
  
  for (Index = 0; Index < 3; Index = Index + 1) {
    i_00 = Vec_IntEntry(vAdds,iBox * 6 + Index);
    p = Vec_WecEntry(vMap,i_00);
    if (i_00 != 0) {
      for (Sum = 0; iVar1 = Vec_IntSize(p), Sum + 1 < iVar1; Sum = Sum + 2) {
        iVar1 = Vec_IntEntry(p,Sum);
        i_01 = Vec_IntEntry(p,Sum + 1);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        if ((iVar2 == i_00) && (iVar2 = Vec_BitEntry(vMarks,i_01), iVar2 == 0)) {
          Vec_IntPush(vRoots,i_01);
          Gia_PolyCollectRoots_rec(vAdds,vMap,vMarks,iVar1,vRoots);
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_PolyCollectRoots_rec( Vec_Int_t * vAdds, Vec_Wec_t * vMap, Vec_Bit_t * vMarks, int iBox, Vec_Int_t * vRoots )
{
    int k;
    for ( k = 0; k < 3; k++ )
    {
        int i, Index, Sum, Carry = Vec_IntEntry( vAdds, 6*iBox+k );
        Vec_Int_t * vLevel = Vec_WecEntry( vMap, Carry );
        if ( Carry == 0 )
            continue;
        Vec_IntForEachEntryDouble( vLevel, Index, Sum, i )
            if ( Vec_IntEntry(vAdds, 6*Index+4) == Carry && !Vec_BitEntry(vMarks, Sum) )
            {
                Vec_IntPush( vRoots, Sum );
                Gia_PolyCollectRoots_rec( vAdds, vMap, vMarks, Index, vRoots );
            }
    }
}